

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCMapping.c
# Opt level: O0

void PPC_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  unsigned_short uVar3;
  uint uVar4;
  long lVar5;
  undefined1 local_d0 [8];
  cs_struct handle;
  int i;
  uint id_local;
  cs_insn *insn_local;
  cs_struct *h_local;
  
  handle.regsize_map._4_4_ = id;
  uVar3 = insn_find(insns,0x458,id,&h->insn_cache);
  handle.regsize_map._0_4_ = (uint)uVar3;
  if (((uint)handle.regsize_map != 0) &&
     (insn->id = (uint)insns[(int)(uint)handle.regsize_map].mapid, h->detail != CS_OPT_OFF)) {
    handle.ITBlock.ITStates._4_4_ = h->detail;
    pcVar1 = insn->detail;
    *(undefined8 *)pcVar1->regs_read = *(undefined8 *)insns[(int)(uint)handle.regsize_map].regs_use;
    *(undefined4 *)(pcVar1->regs_read + 8) =
         *(undefined4 *)(insns[(int)(uint)handle.regsize_map].regs_use + 8);
    uVar4 = count_positive(insns[(int)(uint)handle.regsize_map].regs_use);
    insn->detail->regs_read_count = (uint8_t)uVar4;
    pcVar1 = insn->detail;
    lVar5 = (long)(int)(uint)handle.regsize_map;
    *(undefined8 *)pcVar1->regs_write = *(undefined8 *)insns[lVar5].regs_mod;
    *(undefined8 *)(pcVar1->regs_write + 8) = *(undefined8 *)(insns[lVar5].regs_mod + 8);
    *(undefined4 *)(pcVar1->regs_write + 0x10) = *(undefined4 *)(insns[lVar5].regs_mod + 0x10);
    uVar4 = count_positive(insns[(int)(uint)handle.regsize_map].regs_mod);
    insn->detail->regs_write_count = (uint8_t)uVar4;
    *(undefined8 *)insn->detail->groups = *(undefined8 *)insns[(int)(uint)handle.regsize_map].groups
    ;
    uVar4 = count_positive(insns[(int)(uint)handle.regsize_map].groups);
    insn->detail->groups_count = (uint8_t)uVar4;
    if (((insns[(int)(uint)handle.regsize_map].branch & 1U) != 0) ||
       ((insns[(int)(uint)handle.regsize_map].indirect_branch & 1U) != 0)) {
      insn->detail->groups[insn->detail->groups_count] = '\x01';
      insn->detail->groups_count = insn->detail->groups_count + '\x01';
    }
    _Var2 = cs_reg_write((csh)local_d0,insn,3);
    (insn->detail->field_6).ppc.update_cr0 = _Var2;
  }
  return;
}

Assistant:

void PPC_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	int i;

	i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			cs_struct handle;
			handle.detail = h->detail;

			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
			insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = PPC_GRP_JUMP;
				insn->detail->groups_count++;
			}

			insn->detail->ppc.update_cr0 = cs_reg_write((csh)&handle, insn, PPC_REG_CR0);
#endif
		}
	}
}